

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O1

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetUserProfilePhotos(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  type_conflict4 tVar2;
  undefined8 *puVar3;
  self_type *this_00;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Ptr PVar5;
  path_type local_90;
  vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  local_60;
  vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  local_48;
  
  *(undefined8 *)this = 0;
  puVar3 = (undefined8 *)operator_new(0x30);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_002aa600;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  *(undefined8 **)(this + 8) = puVar3;
  *(undefined8 **)this = puVar3 + 2;
  local_90.m_value._M_dataplus._M_p = (pointer)&local_90.m_value.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"total_count","");
  local_90.m_separator = '.';
  local_90.m_start._M_current = local_90.m_value._M_dataplus._M_p;
  this_00 = boost::property_tree::
            basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_child(in_RDX,&local_90);
  std::locale::locale((locale *)&local_60);
  std::locale::locale((locale *)&local_48,(locale *)&local_60);
  tVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
          get_value<int,boost::property_tree::stream_translator<char,std::char_traits<char>,std::allocator<char>,int>>
                    ((basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)this_00,
                     (stream_translator<char,_std::char_traits<char>,_std::allocator<char>,_int> *)
                     &local_48);
  std::locale::~locale((locale *)&local_48);
  std::locale::~locale((locale *)&local_60);
  *(type_conflict4 *)(puVar3 + 2) = tVar2;
  paVar1 = &local_90.m_value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
  }
  local_90.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"photos","");
  parseJsonAndGet2DArray<TgBot::PhotoSize>
            (&local_60,(TgTypeParser *)data,0x1b7b2e,(ptree *)0x0,&in_RDX->m_data);
  local_48.
  super__Vector_base<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar3[3];
  local_48.
  super__Vector_base<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar3[4];
  local_48.
  super__Vector_base<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar3[5];
  puVar3[3] = local_60.
              super__Vector_base<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  puVar3[4] = local_60.
              super__Vector_base<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  puVar3[5] = local_60.
              super__Vector_base<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_60.
  super__Vector_base<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
  ::~vector(&local_60);
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.m_value._M_dataplus._M_p);
    _Var4._M_pi = extraout_RDX_00;
  }
  PVar5.super___shared_ptr<TgBot::UserProfilePhotos,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  PVar5.super___shared_ptr<TgBot::UserProfilePhotos,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar5.super___shared_ptr<TgBot::UserProfilePhotos,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

UserProfilePhotos::Ptr TgTypeParser::parseJsonAndGetUserProfilePhotos(const ptree& data) const {
    auto result(make_shared<UserProfilePhotos>());
    result->totalCount = data.get<int32_t>("total_count");
    result->photos = parseJsonAndGet2DArray<PhotoSize>(&TgTypeParser::parseJsonAndGetPhotoSize, data, "photos");
    return result;
}